

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

char * __thiscall cmStateSnapshot::GetDefinition(cmStateSnapshot *this,string *name)

{
  StackIter begin;
  StackIter end;
  bool bVar1;
  PointerType pSVar2;
  char *pcVar3;
  string *name_local;
  cmStateSnapshot *this_local;
  
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (!bVar1) {
    __assert_fail("this->Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0xcd,"const char *cmStateSnapshot::GetDefinition(const std::string &) const");
  }
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  begin.Tree = (pSVar2->Vars).Tree;
  begin.Position = (pSVar2->Vars).Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  end.Tree = (pSVar2->Root).Tree;
  end.Position = (pSVar2->Root).Position;
  pcVar3 = cmDefinitions::Get(name,begin,end);
  return pcVar3;
}

Assistant:

const char* cmStateSnapshot::GetDefinition(std::string const& name) const
{
  assert(this->Position->Vars.IsValid());
  return cmDefinitions::Get(name, this->Position->Vars, this->Position->Root);
}